

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

double __thiscall chrono::ChSystem::ComputeCollisions(ChSystem *this)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  long *plVar4;
  int iVar5;
  rep_conflict rVar6;
  long lVar7;
  pointer psVar8;
  pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  
  utils::ChProfileManager::Start_Profile("ComputeCollisions");
  rVar6 = std::chrono::_V2::system_clock::now();
  (this->timer_collision).m_start.__d.__r = rVar6;
  ChAssembly::SyncCollisionModels(&this->assembly);
  (*((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChCollisionSystem[6])();
  (*((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChCollisionSystem[7])();
  (*((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChCollisionSystem[8])();
  utils::ChProfileManager::Start_Profile("ReportContacts");
  peVar1 = (this->collision_system).
           super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_ChCollisionSystem[0xe])
            (peVar1,(this->contact_container).
                    super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  psVar2 = (this->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->assembly).otherphysicslist.
                super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1) {
    peVar3 = (psVar9->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      lVar7 = __dynamic_cast(peVar3,&ChPhysicsItem::typeinfo,&ChContactContainer::typeinfo,0);
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((lVar7 != 0) &&
         (p_Var10 = (psVar9->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi,
         p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
      }
    }
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    peVar3 = (psVar9->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = __dynamic_cast(peVar3,&ChPhysicsItem::typeinfo,&ChProximityContainer::typeinfo,0);
    }
    if (lVar7 == 0) {
      lVar7 = 0;
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var10 = (psVar9->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
      }
    }
    if (lVar7 != 0) {
      peVar1 = (this->collision_system).
               super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_ChCollisionSystem[0xf])(peVar1,lVar7);
    }
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
  }
  utils::ChProfileManager::Stop_Profile();
  psVar8 = (this->collision_callbacks).
           super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->collision_callbacks).
      super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    lVar7 = 0;
    uVar11 = 0;
    do {
      plVar4 = *(long **)((long)&(psVar8->
                                 super___shared_ptr<chrono::ChSystem::CustomCollisionCallback,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar7);
      (**(code **)(*plVar4 + 0x10))(plVar4,this);
      uVar11 = uVar11 + 1;
      psVar8 = (this->collision_callbacks).
               super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar11 < (ulong)((long)(this->collision_callbacks).
                                    super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  iVar5 = (*(((this->contact_container).
              super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3c])();
  this->ncontacts = iVar5;
  lVar7 = std::chrono::_V2::system_clock::now();
  (this->timer_collision).m_end.__d.__r = lVar7;
  (this->timer_collision).m_total.__r =
       (double)(lVar7 - (this->timer_collision).m_start.__d.__r) / 1000000000.0 +
       (this->timer_collision).m_total.__r;
  utils::ChProfileManager::Stop_Profile();
  return 0.0;
}

Assistant:

double ChSystem::ComputeCollisions() {
    CH_PROFILE("ComputeCollisions");

    double mretC = 0.0;

    timer_collision.start();

    // Update all positions of collision models: delegate this to the ChAssembly
    assembly.SyncCollisionModels();

    // Perform the collision detection ( broadphase and narrowphase )
    collision_system->PreProcess();
    collision_system->Run();
    collision_system->PostProcess();

    // Report and store contacts and/or proximities, if there are some
    // containers in the physic system. The default contact container
    // for ChBody and ChParticles is used always.
    {
        CH_PROFILE("ReportContacts");

        collision_system->ReportContacts(contact_container.get());

        for (auto& item : assembly.otherphysicslist) {
            if (auto mcontactcontainer = std::dynamic_pointer_cast<ChContactContainer>(item)) {
                // collision_system->ReportContacts(mcontactcontainer.get());
                // ***TEST*** if one wants to populate a ChContactContainer this would clear it anyway...
            }

            if (auto mproximitycontainer = std::dynamic_pointer_cast<ChProximityContainer>(item)) {
                collision_system->ReportProximities(mproximitycontainer.get());
            }
        }
    }

    // Invoke the custom collision callbacks (if any). These can potentially add
    // additional contacts to the contact container.
    for (size_t ic = 0; ic < collision_callbacks.size(); ic++)
        collision_callbacks[ic]->OnCustomCollision(this);

    // Cache the total number of contacts
    ncontacts = contact_container->GetNcontacts();

    timer_collision.stop();

    return mretC;
}